

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yang.c
# Opt level: O2

void yang_print_snode(lyout *out,int level,lys_node *node,int mask)

{
  lys_node *__s;
  lyout *plVar1;
  ushort uVar2;
  LYS_NODE LVar3;
  int iVar4;
  lys_node *plVar5;
  char *pcVar6;
  char *pcVar7;
  lys_node **pplVar8;
  lys_module *plVar9;
  lys_module *plVar10;
  lys_node *plVar11;
  long lVar12;
  lyout *plVar13;
  lys_ext_instance **pplVar14;
  lyout *plVar15;
  char *pcVar16;
  uint uVar17;
  ulong uVar18;
  lys_node **pplVar19;
  int iVar20;
  uint uVar21;
  LYS_NODE LVar22;
  int iVar23;
  ulong uVar24;
  int local_5c;
  ulong uStack_58;
  int flag_3;
  char *local_50;
  lyout *local_48;
  lys_node *local_40;
  lys_node_inout *inout;
  int flag;
  
  uVar18 = (ulong)(uint)level;
  LVar3 = node->nodetype;
  local_48 = out;
  local_40 = node;
  if ((LVar3 & mask) == LYS_UNKNOWN) goto LAB_0016d945;
  if (((LVar3 & (LYS_OUTPUT|LYS_INPUT)) != LYS_UNKNOWN) && ((node->flags & 0x40) != 0)) {
    return;
  }
  plVar11 = node->parent;
  if (plVar11 == (lys_node *)0x0) {
LAB_0016d92b:
    ly_print(out,"\n");
    LVar3 = local_40->nodetype;
  }
  else if (plVar11->nodetype == LYS_AUGMENT) {
    if (plVar11->child != node) goto LAB_0016d92b;
  }
  else if (node->prev->next != (lys_node *)0x0) goto LAB_0016d92b;
LAB_0016d945:
  plVar11 = local_40;
  plVar13 = local_48;
  LVar22 = mask & LVar3;
  uStack_58 = uVar18;
  switch(LVar22) {
  case LYS_CONTAINER:
    inout._4_4_ = 0;
    ly_print(local_48,"%*scontainer %s",(ulong)(uint)(level * 2),"",local_40->name);
    iVar23 = level + 1;
    yang_print_snode_common(plVar13,iVar23,plVar11,plVar11->module,(int *)((long)&inout + 4),1);
    if (plVar11[1].name != (char *)0x0) {
      yang_print_open(plVar13,(int *)((long)&inout + 4));
      yang_print_when(plVar13,iVar23,plVar11->module,(lys_when *)plVar11[1].name);
    }
    plVar13 = local_48;
    lVar12 = 0;
    for (uVar18 = 0; plVar15 = local_48, uVar18 < plVar11->iffeature_size; uVar18 = uVar18 + 1) {
      yang_print_open(plVar13,(int *)((long)&inout + 4));
      yang_print_iffeature
                (plVar13,iVar23,plVar11->module,
                 (lys_iffeature *)((long)&plVar11->iffeature->expr + lVar12));
      lVar12 = lVar12 + 0x20;
    }
    lVar12 = 0;
    for (uVar18 = 0; plVar13 = local_48, uVar18 < plVar11->padding[2]; uVar18 = uVar18 + 1) {
      yang_print_open(plVar15,(int *)((long)&inout + 4));
      yang_print_must(plVar15,iVar23,local_40->module,(lys_restr *)(local_40[1].dsc + lVar12));
      lVar12 = lVar12 + 0x38;
      plVar11 = local_40;
    }
    lVar12._0_2_ = plVar11[1].flags;
    lVar12._2_1_ = plVar11[1].ext_size;
    lVar12._3_1_ = plVar11[1].iffeature_size;
    lVar12._4_1_ = plVar11[1].padding[0];
    lVar12._5_1_ = plVar11[1].padding[1];
    lVar12._6_1_ = plVar11[1].padding[2];
    lVar12._7_1_ = plVar11[1].padding[3];
    if (lVar12 != 0) {
      yang_print_open(local_48,(int *)((long)&inout + 4));
      yang_print_substmt(plVar13,iVar23,LYEXT_SUBSTMT_PRESENCE,'\0',*(char **)&local_40[1].flags,
                         local_40->module,local_40->ext,(uint)local_40->ext_size);
      plVar11 = local_40;
    }
    yang_print_snode_common(plVar13,iVar23,plVar11,plVar11->module,(int *)((long)&inout + 4),0x74);
    plVar13 = local_48;
    lVar12 = 0;
    for (uVar18 = 0; plVar15 = local_48, uVar18 < plVar11->padding[3]; uVar18 = uVar18 + 1) {
      yang_print_open(plVar13,(int *)((long)&inout + 4));
      yang_print_typedef(plVar13,iVar23,plVar11->module,(lys_tpdf *)(plVar11[1].ref + lVar12));
      lVar12 = lVar12 + 0x80;
    }
    pplVar19 = &plVar11->child;
    pplVar8 = pplVar19;
    while (plVar13 = local_48, plVar5 = *pplVar8, plVar5 != (lys_node *)0x0) {
      if (plVar5->parent == plVar11) {
        yang_print_open(plVar15,(int *)((long)&inout + 4));
        yang_print_snode(plVar15,iVar23,plVar5,0x800);
        plVar11 = local_40;
      }
      pplVar8 = &plVar5->next;
    }
    pplVar8 = pplVar19;
    while (plVar15 = local_48, plVar5 = *pplVar8, plVar5 != (lys_node *)0x0) {
      if (plVar5->parent == plVar11) {
        yang_print_open(plVar13,(int *)((long)&inout + 4));
        yang_print_snode(plVar13,iVar23,plVar5,0x903f);
        plVar11 = local_40;
      }
      pplVar8 = &plVar5->next;
    }
    pplVar8 = pplVar19;
    while (plVar13 = local_48, plVar5 = *pplVar8, plVar5 != (lys_node *)0x0) {
      if (plVar5->parent == plVar11) {
        yang_print_open(plVar15,(int *)((long)&inout + 4));
        yang_print_snode(plVar15,iVar23,plVar5,0x4000);
        plVar11 = local_40;
      }
      pplVar8 = &plVar5->next;
    }
    while (plVar5 = *pplVar19, plVar15 = local_48, plVar5 != (lys_node *)0x0) {
      if (plVar5->parent == plVar11) {
        yang_print_open(plVar13,(int *)((long)&inout + 4));
        yang_print_snode(plVar13,iVar23,plVar5,0x80);
        plVar11 = local_40;
      }
      pplVar19 = &plVar5->next;
    }
    break;
  case LYS_CHOICE:
    inout._4_4_ = 0;
    ly_print(local_48,"%*schoice %s",(ulong)(uint)(level * 2),"",local_40->name);
    iVar23 = level + 1;
    yang_print_snode_common(plVar13,iVar23,plVar11,plVar11->module,(int *)((long)&inout + 4),1);
    if (plVar11[1].name != (char *)0x0) {
      yang_print_open(plVar13,(int *)((long)&inout + 4));
      yang_print_when(plVar13,iVar23,plVar11->module,(lys_when *)plVar11[1].name);
    }
    plVar13 = local_48;
    lVar12 = 0;
    for (uVar18 = 0; plVar15 = local_48, uVar18 < plVar11->iffeature_size; uVar18 = uVar18 + 1) {
      yang_print_open(plVar13,(int *)((long)&inout + 4));
      yang_print_iffeature
                (plVar13,iVar23,plVar11->module,
                 (lys_iffeature *)((long)&plVar11->iffeature->expr + lVar12));
      lVar12 = lVar12 + 0x20;
    }
    if (plVar11[1].dsc != (char *)0x0) {
      yang_print_open(local_48,(int *)((long)&inout + 4));
      yang_print_substmt(plVar15,iVar23,LYEXT_SUBSTMT_DEFAULT,'\0',*(char **)local_40[1].dsc,
                         local_40->module,local_40->ext,(uint)local_40->ext_size);
      plVar11 = local_40;
    }
    yang_print_snode_common(plVar15,iVar23,plVar11,plVar11->module,(int *)((long)&inout + 4),0x7c);
    plVar13 = local_48;
    pplVar19 = &local_40->child;
    plVar11 = local_40;
    while (plVar5 = *pplVar19, plVar15 = local_48, plVar5 != (lys_node *)0x0) {
      if (plVar5->parent == plVar11) {
        yang_print_open(plVar13,(int *)((long)&inout + 4));
        yang_print_snode(plVar13,iVar23,plVar5,0x807f);
        plVar11 = local_40;
      }
      pplVar19 = &plVar5->next;
    }
    break;
  case LYS_CHOICE|LYS_CONTAINER:
  case LYS_LEAF|LYS_CONTAINER:
  case LYS_LEAF|LYS_CHOICE:
  case LYS_LEAF|LYS_CHOICE|LYS_CONTAINER:
    goto switchD_0016dab9_caseD_3;
  case LYS_LEAF:
    uVar21 = level * 2;
    ly_print(local_48,"%*sleaf %s {\n",(ulong)uVar21,"");
    uVar17 = level + 1;
    yang_print_snode_common(plVar13,uVar17,local_40,local_40->module,(int *)0x0,1);
    if ((lys_when *)local_40[1].name != (lys_when *)0x0) {
      yang_print_when(plVar13,uVar17,local_40->module,(lys_when *)local_40[1].name);
    }
    lVar12 = 0;
    for (uVar18 = 0; plVar11 = local_40, plVar13 = local_48, uVar18 < local_40->iffeature_size;
        uVar18 = uVar18 + 1) {
      yang_print_iffeature
                (local_48,uVar17,local_40->module,
                 (lys_iffeature *)((long)&local_40->iffeature->expr + lVar12));
      lVar12 = lVar12 + 0x20;
    }
    yang_print_type(local_48,uVar17,local_40->module,(lys_type *)&local_40[1].ref);
    lVar12 = 0;
    yang_print_substmt(plVar13,uVar17,LYEXT_SUBSTMT_UNITS,'\0',(char *)plVar11[1].next,
                       plVar11->module,plVar11->ext,(uint)plVar11->ext_size);
    for (uVar18 = 0; uVar18 < plVar11->padding[3]; uVar18 = uVar18 + 1) {
      yang_print_must(local_48,uVar17,plVar11->module,(lys_restr *)(plVar11[1].dsc + lVar12));
      lVar12 = lVar12 + 0x38;
    }
    plVar5 = plVar11[1].prev;
    plVar13 = local_48;
    if (plVar5 != (lys_node *)0x0) {
      if ((plVar11->flags & 0x800) != 0) {
        local_50 = (char *)CONCAT44(local_50._4_4_,uVar21);
        uStack_58 = (ulong)uVar17;
        pcVar16 = strchr((char *)plVar5,0x3a);
        plVar11 = local_40;
        if (pcVar16 == (char *)0x0) {
          __assert_fail("strchr(leaf->dflt, \':\')",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/printer_yang.c"
                        ,0x461,"void yang_print_leaf(struct lyout *, int, const struct lys_node *)")
          ;
        }
        plVar9 = lys_node_module(local_40);
        pcVar16 = plVar9->name;
        __s = plVar11[1].prev;
        pcVar6 = strchr((char *)__s,0x3a);
        iVar23 = strncmp((char *)plVar5,pcVar16,(long)pcVar6 - (long)__s);
        plVar9 = plVar11->module;
        if (iVar23 == 0) {
          plVar5 = (lys_node *)lydict_insert(plVar9->ctx,pcVar6 + 1,0);
        }
        else {
          plVar5 = (lys_node *)transform_json2schema(plVar9,(char *)__s);
        }
        uVar17 = (uint)uStack_58;
        plVar11 = local_40;
        uVar21 = (uint)local_50;
      }
      plVar13 = local_48;
      yang_print_substmt(local_48,uVar17,LYEXT_SUBSTMT_DEFAULT,'\0',(char *)plVar5,plVar11->module,
                         plVar11->ext,(uint)plVar11->ext_size);
      plVar11 = local_40;
      if ((local_40->flags & 0x800) != 0) {
        lydict_remove(local_40->module->ctx,(char *)plVar5);
        plVar11 = local_40;
      }
    }
    yang_print_snode_common(plVar13,uVar17,plVar11,plVar11->module,(int *)0x0,0x7c);
    uVar18 = (ulong)uVar21;
    goto LAB_0016f492;
  case LYS_LEAFLIST:
    ly_print(local_48,"%*sleaf-list %s {\n",(ulong)(uint)(level * 2),"");
    uVar17 = level + 1;
    uVar18 = (ulong)uVar17;
    yang_print_snode_common(plVar13,uVar17,local_40,local_40->module,(int *)0x0,1);
    if ((lys_when *)local_40[1].name != (lys_when *)0x0) {
      yang_print_when(plVar13,uVar17,local_40->module,(lys_when *)local_40[1].name);
    }
    lVar12 = 0;
    for (uVar24 = 0; plVar11 = local_40, plVar13 = local_48, uVar24 < local_40->iffeature_size;
        uVar24 = uVar24 + 1) {
      yang_print_iffeature
                (local_48,uVar17,local_40->module,
                 (lys_iffeature *)((long)&local_40->iffeature->expr + lVar12));
      lVar12 = lVar12 + 0x20;
    }
    yang_print_type(local_48,uVar17,local_40->module,(lys_type *)&local_40[1].ref);
    lVar12 = 0;
    yang_print_substmt(plVar13,uVar17,LYEXT_SUBSTMT_UNITS,'\0',(char *)plVar11[1].next,
                       plVar11->module,plVar11->ext,(uint)plVar11->ext_size);
    for (uVar24 = 0; uVar24 < plVar11->padding[3]; uVar24 = uVar24 + 1) {
      yang_print_must(local_48,uVar17,plVar11->module,(lys_restr *)(plVar11[1].dsc + lVar12));
      lVar12 = lVar12 + 0x38;
    }
    plVar13 = local_48;
    uStack_58 = uVar18;
    for (uVar24 = 0; uVar24 < plVar11->padding[2]; uVar24 = uVar24 + 1) {
      pcVar16 = *(char **)((plVar11[1].prev)->padding + uVar24 * 8 + -0x1c);
      if ((plVar11->flags & 0x800) != 0) {
        pcVar6 = strchr(pcVar16,0x3a);
        plVar11 = local_40;
        if (pcVar6 == (char *)0x0) {
          __assert_fail("strchr(llist->dflt[i], \':\')",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/printer_yang.c"
                        ,0x4ab,
                        "void yang_print_leaflist(struct lyout *, int, const struct lys_node *)");
        }
        plVar9 = lys_node_module(local_40);
        local_50 = plVar9->name;
        pcVar6 = *(char **)((plVar11[1].prev)->padding + uVar24 * 8 + -0x1c);
        pcVar7 = strchr(pcVar6,0x3a);
        iVar23 = strncmp(pcVar16,local_50,(long)pcVar7 - (long)pcVar6);
        plVar9 = plVar11->module;
        if (iVar23 == 0) {
          pcVar16 = lydict_insert(plVar9->ctx,pcVar7 + 1,0);
          plVar11 = local_40;
          uVar18 = uStack_58;
          plVar13 = local_48;
        }
        else {
          pcVar16 = transform_json2schema(plVar9,pcVar6);
          plVar11 = local_40;
          uVar18 = uStack_58;
          plVar13 = local_48;
        }
      }
      yang_print_substmt(plVar13,(int)uVar18,LYEXT_SUBSTMT_DEFAULT,(uint8_t)uVar24,pcVar16,
                         plVar11->module,plVar11->ext,(uint)plVar11->ext_size);
      if ((local_40->flags & 0x800) != 0) {
        lydict_remove(local_40->module->ctx,pcVar16);
      }
      plVar11 = local_40;
    }
    iVar23 = (int)uVar18;
    yang_print_snode_common(plVar13,iVar23,plVar11,plVar11->module,(int *)0x0,4);
    if (*(uint *)&local_40[1].priv != 0) {
      yang_print_unsigned(plVar13,iVar23,LYEXT_SUBSTMT_MIN,'\0',local_40->module,local_40->ext,
                          (uint)local_40->ext_size,*(uint *)&local_40[1].priv);
    }
    uVar17 = *(uint *)((long)&local_40[1].priv + 4);
    if (uVar17 != 0) {
      yang_print_unsigned(plVar13,iVar23,LYEXT_SUBSTMT_MAX,'\0',local_40->module,local_40->ext,
                          (uint)local_40->ext_size,uVar17);
    }
    plVar11 = local_40;
    if ((local_40->flags & 0x100) == 0) {
      iVar4 = lys_ext_iter(local_40->ext,local_40->ext_size,'\0',LYEXT_SUBSTMT_ORDEREDBY);
      if (iVar4 != -1) {
        pcVar16 = "system";
        goto LAB_0016f18d;
      }
    }
    else {
      pcVar16 = "user";
LAB_0016f18d:
      yang_print_substmt(plVar13,iVar23,LYEXT_SUBSTMT_ORDEREDBY,'\0',pcVar16,plVar11->module,
                         plVar11->ext,(uint)plVar11->ext_size);
    }
    yang_print_snode_common(plVar13,iVar23,plVar11,plVar11->module,(int *)0x0,0x70);
    uVar18 = (ulong)(uint)(level * 2);
LAB_0016f492:
    ly_print(plVar13,"%*s}\n",uVar18,"");
    return;
  default:
    if (LVar22 == LYS_LIST) {
      inout._4_4_ = 0;
      ly_print(local_48,"%*slist %s",(ulong)(uint)(level * 2),"",local_40->name);
      uVar17 = level + 1;
      yang_print_snode_common(plVar13,uVar17,plVar11,plVar11->module,(int *)((long)&inout + 4),1);
      if (plVar11[1].name != (char *)0x0) {
        yang_print_open(plVar13,(int *)((long)&inout + 4));
        yang_print_when(plVar13,uVar17,plVar11->module,(lys_when *)plVar11[1].name);
      }
      plVar13 = local_48;
      lVar12 = 0;
      for (uVar18 = 0; plVar15 = local_48, uVar18 < plVar11->iffeature_size; uVar18 = uVar18 + 1) {
        yang_print_open(plVar13,(int *)((long)&inout + 4));
        yang_print_iffeature
                  (plVar13,uVar17,plVar11->module,
                   (lys_iffeature *)((long)&plVar11->iffeature->expr + lVar12));
        lVar12 = lVar12 + 0x20;
      }
      lVar12 = 0;
      for (uVar18 = 0; plVar13 = local_48, uVar18 < plVar11->padding[0]; uVar18 = uVar18 + 1) {
        yang_print_open(plVar15,(int *)((long)&inout + 4));
        yang_print_must(plVar15,uVar17,local_40->module,(lys_restr *)(local_40[1].dsc + lVar12));
        lVar12 = lVar12 + 0x38;
        plVar11 = local_40;
      }
      if (plVar11->padding[2] != '\0') {
        yang_print_open(local_48,(int *)((long)&inout + 4));
        yang_print_substmt(plVar13,uVar17,LYEXT_SUBSTMT_KEY,'\0',(char *)local_40[1].module,
                           local_40->module,local_40->ext,(uint)local_40->ext_size);
        plVar11 = local_40;
      }
      iVar23 = (int)uStack_58;
      local_50 = (char *)(ulong)uVar17;
      for (uVar18 = 0; iVar4 = (int)local_50, uVar18 < plVar11->padding[3]; uVar18 = uVar18 + 1) {
        yang_print_open(plVar13,(int *)((long)&inout + 4));
        yang_print_unique(plVar13,iVar4,(lys_unique *)(local_40[1].ext + uVar18 * 2));
        plVar11 = local_40;
        pplVar14 = local_40->ext;
        iVar4 = -1;
        while (iVar4 = lys_ext_iter(pplVar14,plVar11->ext_size,(char)iVar4 + '\x01',
                                    LYEXT_SUBSTMT_UNIQUE), iVar4 != -1) {
          pplVar14 = plVar11->ext;
          if (uVar18 == pplVar14[iVar4]->insubstmt_index) {
            ly_print(plVar13," {\n");
            pplVar14 = local_40->ext;
            plVar11 = local_40;
            do {
              yang_print_extension_instances
                        (local_48,iVar23 + 2,plVar11->module,LYEXT_SUBSTMT_UNIQUE,(uint8_t)uVar18,
                         pplVar14 + iVar4,1);
              plVar11 = local_40;
              pplVar14 = local_40->ext;
              do {
                iVar4 = lys_ext_iter(pplVar14,plVar11->ext_size,(char)iVar4 + '\x01',
                                     LYEXT_SUBSTMT_UNIQUE);
                plVar13 = local_48;
                if (iVar4 == -1) {
                  ly_print(local_48,"%*s}\n",uVar17 * 2,"");
                  goto LAB_0016e8ae;
                }
                pplVar14 = plVar11->ext;
              } while (uVar18 != pplVar14[iVar4]->insubstmt_index);
            } while( true );
          }
        }
        ly_print(plVar13,";\n");
LAB_0016e8ae:
        plVar11 = local_40;
      }
      yang_print_snode_common(plVar13,iVar4,plVar11,plVar11->module,(int *)((long)&inout + 4),4);
      if (*(int *)&local_40[1].iffeature != 0) {
        yang_print_open(plVar13,(int *)((long)&inout + 4));
        yang_print_unsigned(plVar13,iVar4,LYEXT_SUBSTMT_MIN,'\0',local_40->module,local_40->ext,
                            (uint)local_40->ext_size,*(uint *)&local_40[1].iffeature);
      }
      if (*(int *)((long)&local_40[1].iffeature + 4) != 0) {
        yang_print_open(plVar13,(int *)((long)&inout + 4));
        yang_print_unsigned(plVar13,iVar4,LYEXT_SUBSTMT_MAX,'\0',local_40->module,local_40->ext,
                            (uint)local_40->ext_size,*(uint *)((long)&local_40[1].iffeature + 4));
      }
      plVar11 = local_40;
      if ((local_40->flags & 0x100) == 0) {
        iVar23 = lys_ext_iter(local_40->ext,local_40->ext_size,'\0',LYEXT_SUBSTMT_ORDEREDBY);
        plVar13 = local_48;
        if (iVar23 != -1) {
          pcVar16 = "system";
          goto LAB_0016f1e4;
        }
      }
      else {
        pcVar16 = "user";
LAB_0016f1e4:
        plVar13 = local_48;
        yang_print_open(local_48,(int *)((long)&inout + 4));
        plVar11 = local_40;
        yang_print_substmt(plVar13,iVar4,LYEXT_SUBSTMT_ORDEREDBY,'\0',pcVar16,local_40->module,
                           local_40->ext,(uint)local_40->ext_size);
      }
      yang_print_snode_common(plVar13,iVar4,plVar11,plVar11->module,(int *)((long)&inout + 4),0x70);
      plVar13 = local_48;
      lVar12 = 0;
      for (uVar18 = 0; plVar15 = local_48, uVar18 < plVar11->padding[1]; uVar18 = uVar18 + 1) {
        yang_print_open(plVar13,(int *)((long)&inout + 4));
        yang_print_typedef(plVar13,iVar4,plVar11->module,(lys_tpdf *)(plVar11[1].ref + lVar12));
        lVar12 = lVar12 + 0x80;
      }
      pplVar19 = &plVar11->child;
      pplVar8 = pplVar19;
      while (plVar13 = local_48, plVar5 = *pplVar8, plVar5 != (lys_node *)0x0) {
        if (plVar5->parent == plVar11) {
          yang_print_open(plVar15,(int *)((long)&inout + 4));
          yang_print_snode(plVar15,iVar4,plVar5,0x800);
          plVar11 = local_40;
        }
        pplVar8 = &plVar5->next;
      }
      pplVar8 = pplVar19;
      while (plVar15 = local_48, plVar5 = *pplVar8, plVar5 != (lys_node *)0x0) {
        if (plVar5->parent == plVar11) {
          yang_print_open(plVar13,(int *)((long)&inout + 4));
          yang_print_snode(plVar13,iVar4,plVar5,0x983f);
          plVar11 = local_40;
        }
        pplVar8 = &plVar5->next;
      }
      pplVar8 = pplVar19;
      while (plVar13 = local_48, plVar5 = *pplVar8, plVar5 != (lys_node *)0x0) {
        if (plVar5->parent == plVar11) {
          yang_print_open(plVar15,(int *)((long)&inout + 4));
          yang_print_snode(plVar15,iVar4,plVar5,0x4000);
          plVar11 = local_40;
        }
        pplVar8 = &plVar5->next;
      }
      while (plVar5 = *pplVar19, plVar15 = local_48, plVar5 != (lys_node *)0x0) {
        if (plVar5->parent == plVar11) {
          yang_print_open(plVar13,(int *)((long)&inout + 4));
          yang_print_snode(plVar13,iVar4,plVar5,0x80);
          plVar11 = local_40;
        }
        pplVar19 = &plVar5->next;
      }
      break;
    }
    if (LVar22 == LYS_ANYXML) {
LAB_0016d9db:
      inout._4_4_ = 0;
      pcVar16 = "anydata";
      if (LVar3 == LYS_ANYXML) {
        pcVar16 = "anyxml";
      }
      ly_print(local_48,"%*s%s %s",(ulong)(uint)(level * 2),"",pcVar16,local_40->name);
      iVar23 = level + 1;
      yang_print_snode_common(plVar13,iVar23,plVar11,plVar11->module,(int *)((long)&inout + 4),1);
      if (plVar11[1].name != (char *)0x0) {
        yang_print_open(plVar13,(int *)((long)&inout + 4));
        yang_print_when(plVar13,iVar23,plVar11->module,(lys_when *)plVar11[1].name);
      }
      plVar13 = local_48;
      lVar12 = 0;
      for (uVar18 = 0; plVar1 = local_48, uVar18 < plVar11->iffeature_size; uVar18 = uVar18 + 1) {
        yang_print_open(plVar13,(int *)((long)&inout + 4));
        yang_print_iffeature
                  (plVar13,iVar23,plVar11->module,
                   (lys_iffeature *)((long)&plVar11->iffeature->expr + lVar12));
        lVar12 = lVar12 + 0x20;
      }
      lVar12 = 0;
      for (uVar18 = 0; plVar15 = local_48, uVar18 < plVar11->padding[3]; uVar18 = uVar18 + 1) {
        yang_print_open(plVar1,(int *)((long)&inout + 4));
        yang_print_must(plVar1,iVar23,local_40->module,(lys_restr *)(local_40[1].dsc + lVar12));
        lVar12 = lVar12 + 0x38;
        plVar11 = local_40;
      }
      yang_print_snode_common
                (local_48,iVar23,plVar11,plVar11->module,(int *)((long)&inout + 4),0x7c);
      break;
    }
    if (LVar22 == LYS_CASE) {
      inout._4_4_ = 0;
      if ((local_40->flags & 0x40) == 0) {
        ly_print(local_48,"%*scase %s",(ulong)(uint)(level * 2),"",local_40->name);
        level = level + 1;
        yang_print_snode_common(plVar13,level,local_40,local_40->module,(int *)((long)&inout + 4),1)
        ;
        if (local_40[1].name != (char *)0x0) {
          yang_print_open(plVar13,(int *)((long)&inout + 4));
          yang_print_when(plVar13,level,local_40->module,(lys_when *)local_40[1].name);
        }
        yang_print_snode_common
                  (plVar13,level,local_40,local_40->module,(int *)((long)&inout + 4),0x72);
      }
      else {
        inout._4_4_ = 1;
      }
      plVar13 = local_48;
      pplVar19 = &local_40->child;
      plVar11 = local_40;
      while (plVar5 = *pplVar19, plVar5 != (lys_node *)0x0) {
        if (plVar5->parent == plVar11) {
          yang_print_open(plVar13,(int *)((long)&inout + 4));
          yang_print_snode(plVar13,level,plVar5,0x903f);
          plVar11 = local_40;
        }
        pplVar19 = &plVar5->next;
      }
      if ((plVar11->flags & 0x40) != 0) {
        return;
      }
      iVar23 = level + -1;
      plVar15 = local_48;
      iVar4 = inout._4_4_;
      goto LAB_0016f3eb;
    }
    if (LVar22 == LYS_NOTIF) {
      inout._4_4_ = 0;
      lVar12 = 0;
      ly_print(local_48,"%*snotification %s",(ulong)(uint)(level * 2),"",local_40->name);
      iVar23 = level + 1;
      yang_print_snode_common(plVar13,iVar23,plVar11,plVar11->module,(int *)((long)&inout + 4),3);
      plVar13 = local_48;
      for (uVar18 = 0; uVar18 < plVar11->padding[3]; uVar18 = uVar18 + 1) {
        yang_print_open(plVar13,(int *)((long)&inout + 4));
        yang_print_must(plVar13,iVar23,plVar11->module,(lys_restr *)(plVar11[1].dsc + lVar12));
        lVar12 = lVar12 + 0x38;
      }
      yang_print_snode_common
                (local_48,iVar23,plVar11,plVar11->module,(int *)((long)&inout + 4),0x70);
      plVar13 = local_48;
      lVar12 = 0;
      for (uVar18 = 0; plVar15 = local_48, uVar18 < plVar11->padding[2]; uVar18 = uVar18 + 1) {
        yang_print_open(plVar13,(int *)((long)&inout + 4));
        yang_print_typedef(plVar13,iVar23,plVar11->module,(lys_tpdf *)(plVar11[1].name + lVar12));
        lVar12 = lVar12 + 0x80;
      }
      pplVar19 = &plVar11->child;
      pplVar8 = pplVar19;
      while (plVar13 = local_48, plVar5 = *pplVar8, plVar5 != (lys_node *)0x0) {
        if (plVar5->parent == plVar11) {
          yang_print_open(plVar15,(int *)((long)&inout + 4));
          yang_print_snode(plVar15,iVar23,plVar5,0x800);
          plVar11 = local_40;
        }
        pplVar8 = &plVar5->next;
      }
      while (plVar5 = *pplVar19, plVar15 = local_48, plVar5 != (lys_node *)0x0) {
        if (plVar5->parent == plVar11) {
          yang_print_open(plVar13,(int *)((long)&inout + 4));
          yang_print_snode(plVar13,iVar23,plVar5,0x903f);
          plVar11 = local_40;
        }
        pplVar19 = &plVar5->next;
      }
      break;
    }
    if (LVar22 == LYS_RPC) {
LAB_0016db76:
      inout._4_4_ = 0;
      pcVar16 = "action";
      if (LVar3 == LYS_RPC) {
        pcVar16 = "rpc";
      }
      lVar12 = 0;
      ly_print(local_48,"%*s%s %s",(ulong)(uint)(level * 2),"",pcVar16,local_40->name);
      iVar23 = level + 1;
      yang_print_snode_common(plVar13,iVar23,plVar11,plVar11->module,(int *)((long)&inout + 4),0x73)
      ;
      plVar13 = local_48;
      for (uVar18 = 0; plVar1 = local_48, uVar18 < plVar11->padding[3]; uVar18 = uVar18 + 1) {
        yang_print_open(plVar13,(int *)((long)&inout + 4));
        yang_print_typedef(plVar13,iVar23,plVar11->module,(lys_tpdf *)(plVar11[1].name + lVar12));
        lVar12 = lVar12 + 0x80;
      }
      pplVar19 = &plVar11->child;
      while (plVar5 = *pplVar19, plVar15 = local_48, plVar5 != (lys_node *)0x0) {
        if ((plVar5->parent == plVar11) &&
           (((plVar5->nodetype & (LYS_OUTPUT|LYS_INPUT)) == LYS_UNKNOWN ||
            ((plVar5->flags & 0x40) == 0)))) {
          yang_print_open(plVar1,(int *)((long)&inout + 4));
          yang_print_snode(plVar1,iVar23,plVar5,0xe00);
          plVar11 = local_40;
        }
        pplVar19 = &plVar5->next;
      }
      break;
    }
    if ((LVar22 == LYS_INPUT) || (LVar22 == LYS_OUTPUT)) {
      ly_print(local_48,"%*s%s {\n",(ulong)(uint)(level * 2),"");
      iVar23 = level + 1;
      if (local_40->ext_size != 0) {
        yang_print_extension_instances
                  (plVar13,iVar23,local_40->module,LYEXT_SUBSTMT_SELF,'\0',local_40->ext,
                   (uint)local_40->ext_size);
      }
      lVar12 = 0;
      for (uVar18 = 0; uVar18 < local_40->padding[3]; uVar18 = uVar18 + 1) {
        yang_print_must(local_48,iVar23,local_40->module,(lys_restr *)(local_40[1].dsc + lVar12));
        lVar12 = lVar12 + 0x38;
      }
      lVar12 = 0;
      for (uVar18 = 0; uVar18 < local_40->padding[2]; uVar18 = uVar18 + 1) {
        yang_print_typedef(local_48,iVar23,local_40->module,(lys_tpdf *)(local_40[1].name + lVar12))
        ;
        lVar12 = lVar12 + 0x80;
      }
      pplVar19 = &local_40->child;
      plVar11 = local_40;
      pplVar8 = pplVar19;
      while (plVar5 = *pplVar8, plVar5 != (lys_node *)0x0) {
        if (plVar5->parent == plVar11) {
          yang_print_snode(local_48,iVar23,plVar5,0x800);
          plVar11 = local_40;
        }
        pplVar8 = &plVar5->next;
      }
      while (plVar5 = *pplVar19, plVar5 != (lys_node *)0x0) {
        if (plVar5->parent == plVar11) {
          yang_print_snode(local_48,iVar23,plVar5,0x903f);
          plVar11 = local_40;
        }
        pplVar19 = &plVar5->next;
      }
      uVar18 = (ulong)(uint)(level * 2);
      plVar13 = local_48;
      goto LAB_0016f492;
    }
    if (LVar22 == LYS_GROUPING) {
      inout._4_4_ = 0;
      lVar12 = 0;
      ly_print(local_48,"%*sgrouping %s",(ulong)(uint)(level * 2),"",local_40->name);
      iVar20 = level + 1;
      yang_print_snode_common(plVar13,iVar20,plVar11,plVar11->module,(int *)((long)&inout + 4),0x71)
      ;
      plVar13 = local_48;
      for (uVar18 = 0; plVar15 = local_48, uVar18 < plVar11->padding[3]; uVar18 = uVar18 + 1) {
        yang_print_open(plVar13,(int *)((long)&inout + 4));
        yang_print_typedef(plVar13,iVar20,plVar11->module,(lys_tpdf *)(plVar11[1].name + lVar12));
        lVar12 = lVar12 + 0x80;
      }
      pplVar8 = &plVar11->child;
      pplVar19 = pplVar8;
      while (plVar13 = local_48, plVar11 = *pplVar19, plVar11 != (lys_node *)0x0) {
        yang_print_open(plVar15,(int *)((long)&inout + 4));
        yang_print_snode(plVar15,iVar20,plVar11,0x800);
        pplVar19 = &plVar11->next;
      }
      pplVar19 = pplVar8;
      while (plVar15 = local_48, plVar11 = *pplVar19, plVar11 != (lys_node *)0x0) {
        yang_print_open(plVar13,(int *)((long)&inout + 4));
        yang_print_snode(plVar13,iVar20,plVar11,0x903f);
        pplVar19 = &plVar11->next;
      }
      pplVar19 = pplVar8;
      while (plVar13 = local_48, plVar11 = *pplVar19, plVar11 != (lys_node *)0x0) {
        yang_print_open(plVar15,(int *)((long)&inout + 4));
        yang_print_snode(plVar15,iVar20,plVar11,0x4000);
        pplVar19 = &plVar11->next;
      }
      iVar23 = (int)uStack_58;
      while (plVar11 = *pplVar8, plVar15 = local_48, iVar4 = inout._4_4_, plVar11 != (lys_node *)0x0
            ) {
        yang_print_open(plVar13,(int *)((long)&inout + 4));
        yang_print_snode(plVar13,iVar20,plVar11,0x80);
        pplVar8 = &plVar11->next;
      }
    }
    else {
      if (LVar22 != LYS_USES) {
        if (LVar22 != LYS_ACTION) {
          if (LVar22 != LYS_ANYDATA) {
            return;
          }
          goto LAB_0016d9db;
        }
        goto LAB_0016db76;
      }
      local_5c = 0;
      ly_print(local_48,"%*suses ",(ulong)(uint)(level * 2),"");
      if (local_40->child != (lys_node *)0x0) {
        plVar9 = lys_node_module(local_40->child);
        plVar10 = lys_node_module(local_40);
        if (plVar10 != plVar9) {
          pcVar16 = transform_module_name2import_prefix(local_40->module,plVar9->name);
          ly_print(plVar13,"%s:",pcVar16);
        }
      }
      ly_print(plVar13,"%s",local_40->name);
      iVar20 = level + 1;
      yang_print_snode_common(plVar13,iVar20,local_40,local_40->module,&local_5c,1);
      if (local_40[1].name != (char *)0x0) {
        yang_print_open(plVar13,&local_5c);
        yang_print_when(plVar13,iVar20,local_40->module,(lys_when *)local_40[1].name);
      }
      yang_print_snode_common(plVar13,iVar20,local_40,local_40->module,&local_5c,0x72);
      local_50 = (char *)CONCAT44(local_50._4_4_,level + 2);
      for (uVar24 = 0; plVar11 = local_40, uVar24 < local_40->padding[2]; uVar24 = uVar24 + 1) {
        yang_print_open(plVar13,&local_5c);
        plVar9 = plVar11->module;
        pcVar16 = plVar11[1].dsc;
        plVar11 = (lys_node *)(pcVar16 + uVar24 * 0x50);
        inout._4_4_ = 0;
        pcVar16 = transform_json2schema(plVar9,*(char **)(pcVar16 + uVar24 * 0x50));
        ly_print(plVar13,"%*srefine \"%s\"",(ulong)(uint)(iVar20 * 2),"",pcVar16);
        lydict_remove(plVar9->ctx,pcVar16);
        yang_print_snode_common(plVar13,(uint)local_50,plVar11,plVar9,(int *)((long)&inout + 4),3);
        lVar12 = 0;
        for (uVar18 = 0; plVar13 = local_48, uVar18 < plVar11->padding[2]; uVar18 = uVar18 + 1) {
          yang_print_open(local_48,(int *)((long)&inout + 4));
          yang_print_must(plVar13,(uint)local_50,plVar9,
                          (lys_restr *)(*(long *)&plVar11->nodetype + lVar12));
          lVar12 = lVar12 + 0x38;
        }
        if (*(short *)plVar11->padding == 1) {
          yang_print_open(local_48,(int *)((long)&inout + 4));
          yang_print_substmt(plVar13,(uint)local_50,LYEXT_SUBSTMT_PRESENCE,'\0',
                             (char *)plVar11->child,plVar9,plVar11->ext,(uint)plVar11->ext_size);
        }
        for (uVar18 = 0; uVar18 < plVar11->padding[3]; uVar18 = uVar18 + 1) {
          yang_print_open(plVar13,(int *)((long)&inout + 4));
          yang_print_substmt(plVar13,(uint)local_50,LYEXT_SUBSTMT_DEFAULT,(uint8_t)uVar18,
                             *(char **)(plVar11->parent->padding + uVar18 * 8 + -0x1c),plVar9,
                             plVar11->ext,(uint)plVar11->ext_size);
        }
        pcVar16 = "true";
        if (((plVar11->flags & 1) != 0) || (pcVar16 = "false", (plVar11->flags & 2) != 0)) {
          yang_print_open(plVar13,(int *)((long)&inout + 4));
          yang_print_substmt(plVar13,(uint)local_50,LYEXT_SUBSTMT_CONFIG,'\0',pcVar16,plVar9,
                             plVar11->ext,(uint)plVar11->ext_size);
        }
        pcVar16 = "true";
        if (((plVar11->flags & 0x40) != 0) || (pcVar16 = "false", (char)plVar11->flags < '\0')) {
          yang_print_open(plVar13,(int *)((long)&inout + 4));
          yang_print_substmt(plVar13,(uint)local_50,LYEXT_SUBSTMT_MANDATORY,'\0',pcVar16,plVar9,
                             plVar11->ext,(uint)plVar11->ext_size);
        }
        if ((plVar11->padding[0] & 0x18) != 0) {
          uVar2 = plVar11->flags;
          if ((uVar2 & 0x10) != 0) {
            yang_print_open(plVar13,(int *)((long)&inout + 4));
            yang_print_unsigned(plVar13,(uint)local_50,LYEXT_SUBSTMT_MIN,'\0',plVar9,plVar11->ext,
                                (uint)plVar11->ext_size,*(uint *)&plVar11->child);
            uVar2 = plVar11->flags;
          }
          if ((uVar2 & 8) != 0) {
            yang_print_open(plVar13,(int *)((long)&inout + 4));
            uVar17 = *(uint *)((long)&plVar11->child + 4);
            if (uVar17 == 0) {
              yang_print_substmt(plVar13,(uint)local_50,LYEXT_SUBSTMT_MAX,'\0',"unbounded",plVar9,
                                 plVar11->ext,(uint)plVar11->ext_size);
            }
            else {
              yang_print_unsigned(plVar13,(uint)local_50,LYEXT_SUBSTMT_MAX,'\0',plVar9,plVar11->ext,
                                  (uint)plVar11->ext_size,uVar17);
            }
          }
        }
        yang_print_snode_common
                  (plVar13,(uint)local_50,plVar11,plVar9,(int *)((long)&inout + 4),0x60);
        yang_print_close(plVar13,iVar20,inout._4_4_);
        uVar18 = uStack_58;
      }
      lVar12 = 0;
      for (uVar24 = 0; plVar13 = local_48, iVar23 = (int)uVar18, plVar15 = local_48,
          iVar4 = local_5c, uVar24 < local_40->padding[3]; uVar24 = uVar24 + 1) {
        yang_print_open(local_48,&local_5c);
        uVar18 = uStack_58;
        yang_print_augment(plVar13,iVar20,(lys_node_augment *)(local_40[1].ref + lVar12));
        lVar12 = lVar12 + 0x68;
      }
    }
    goto LAB_0016f3eb;
  }
  iVar23 = (int)uStack_58;
  iVar4 = inout._4_4_;
LAB_0016f3eb:
  yang_print_close(plVar15,iVar23,iVar4);
switchD_0016dab9_caseD_3:
  return;
}

Assistant:

static void
yang_print_snode(struct lyout *out, int level, const struct lys_node *node, int mask)
{
    if (node->nodetype & mask) {
        if ((node->nodetype & (LYS_INPUT | LYS_OUTPUT)) && (node->flags & LYS_IMPLICIT)) {
            /* implicit input/output node is not supposed to be printed */
            return;
        } else if (!node->parent ||
                (node->parent->nodetype == LYS_AUGMENT && node != node->parent->child) ||
                (node->parent->nodetype != LYS_AUGMENT && node->prev->next)) {
            /* do not print the blank line before the first data-def node */
            ly_print(out, "\n");
        }
    }

    switch (node->nodetype & mask) {
    case LYS_CONTAINER:
        yang_print_container(out, level, node);
        break;
    case LYS_CHOICE:
        yang_print_choice(out, level, node);
        break;
    case LYS_LEAF:
        yang_print_leaf(out, level, node);
        break;
    case LYS_LEAFLIST:
        yang_print_leaflist(out, level, node);
        break;
    case LYS_LIST:
        yang_print_list(out, level, node);
        break;
    case LYS_USES:
        yang_print_uses(out, level, node);
        break;
    case LYS_GROUPING:
        yang_print_grouping(out, level, node);
        break;
    case LYS_ANYXML:
    case LYS_ANYDATA:
        yang_print_anydata(out, level, node);
        break;
    case LYS_CASE:
        yang_print_case(out, level, node);
        break;
    case LYS_RPC:
    case LYS_ACTION:
        yang_print_rpc_action(out, level, node);
        break;
    case LYS_INPUT:
    case LYS_OUTPUT:
        yang_print_input_output(out, level, node);
        break;
    case LYS_NOTIF:
        yang_print_notif(out, level, node);
        break;
    default:
        break;
    }
}